

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkerHelpers.hpp
# Opt level: O3

string * __thiscall
bredis::marker_helpers::stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>::
operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,
          array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  pointer pvVar1;
  long *plVar2;
  long *plVar3;
  pointer this_00;
  long *local_78;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  result_type local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x205d79617272615b;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x7b;
  __return_storage_ptr__->_M_string_length = 9;
  this_00 = (value->elements).
            super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (value->elements).
           super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pvVar1) {
    do {
      boost::
      variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>>>
      ::
      apply_visitor<bredis::marker_helpers::stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>const>
                (&local_50,
                 (variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>>>
                  *)this_00,
                 (stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)this
                );
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = plVar2[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
        local_78 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pvVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
    operator()(const markers::array_holder_t<Iterator> &value) const {
        std::string r = "[array] {";
        for (const auto &v : value.elements) {
            r += boost::apply_visitor(*this, v) + ", ";
        }
        r += "}";
        return r;
    }